

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::TiledOutputFile::copyPixels(TiledOutputFile *this,TiledInputFile *in)

{
  LineOrder LVar1;
  bool bVar2;
  LevelMode LVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  ArgExc *pAVar8;
  TileDescription *this_00;
  TileDescription *other;
  LineOrder *pLVar9;
  Compression *lx_00;
  TiledOutputFile *this_01;
  LogicExc *this_02;
  reference pvVar10;
  OutputStreamMutex *in_RSI;
  TiledOutputFile *in_RDI;
  TileCoord TVar11;
  int ly;
  int lx;
  int dy;
  int dx;
  int pixelDataSize;
  char *pixelData;
  int i;
  vector<int,_std::allocator<int>_> ly_table;
  vector<int,_std::allocator<int>_> lx_table;
  vector<int,_std::allocator<int>_> dy_table;
  vector<int,_std::allocator<int>_> dx_table;
  bool random_y;
  int i_lx;
  int i_ly;
  int i_l;
  int numAllTiles;
  stringstream _iex_throw_s_6;
  stringstream _iex_throw_s_5;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  Header *inHdr;
  Header *hdr;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffff138;
  undefined4 in_stack_fffffffffffff140;
  undefined4 in_stack_fffffffffffff144;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffff148;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffff150;
  Data *in_stack_fffffffffffff158;
  OutputStreamMutex *in_stack_fffffffffffff160;
  TileOffsets *in_stack_fffffffffffff168;
  Data *in_stack_fffffffffffff170;
  reference in_stack_fffffffffffff178;
  ChannelList *in_stack_fffffffffffff180;
  ChannelList *in_stack_fffffffffffff188;
  undefined4 in_stack_fffffffffffff190;
  undefined4 in_stack_fffffffffffff194;
  TiledOutputFile *in_stack_fffffffffffff2f0;
  Compression lx_01;
  int *in_stack_fffffffffffff310;
  int *in_stack_fffffffffffff318;
  TiledInputFile *in_stack_fffffffffffff320;
  int local_b88;
  vector<int,_std::allocator<int>_> local_b80;
  vector<int,_std::allocator<int>_> local_b60;
  vector<int,_std::allocator<int>_> local_b40;
  vector<int,_std::allocator<int>_> local_b20;
  byte local_b01;
  int local_b00;
  int local_afc;
  int local_af8;
  int local_af4;
  stringstream local_af0 [16];
  ostream local_ae0 [376];
  stringstream local_968 [16];
  ostream local_958 [48];
  char **in_stack_fffffffffffff6d8;
  int *in_stack_fffffffffffff6e0;
  int *in_stack_fffffffffffff6e8;
  int *in_stack_fffffffffffff6f0;
  int *in_stack_fffffffffffff6f8;
  TiledInputFile *in_stack_fffffffffffff700;
  int *in_stack_fffffffffffff710;
  stringstream local_7e0 [16];
  ostream local_7d0 [376];
  stringstream local_658 [16];
  ostream local_648 [376];
  stringstream local_4d0 [16];
  ostream local_4c0 [376];
  stringstream local_348 [16];
  ostream local_338 [376];
  stringstream local_1c0 [16];
  ostream local_1b0 [392];
  Header *local_28;
  Data *local_20;
  OutputStreamMutex *local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140)
             ,in_stack_fffffffffffff138);
  local_20 = in_RDI->_data;
  local_28 = TiledInputFile::header
                       ((TiledInputFile *)
                        CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  bVar2 = Header::hasTileDescription((Header *)0x243610);
  if ((!bVar2) || (bVar2 = Header::hasTileDescription((Header *)0x243633), !bVar2)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar6 = std::operator<<(local_1b0,"Cannot perform a quick pixel copy from image file \"");
    pcVar7 = TiledInputFile::fileName((TiledInputFile *)0x243690);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\" to image file \"");
    pcVar7 = fileName((TiledOutputFile *)0x2436e4);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,
                    "\".  The output file is tiled, but the input file is not.  Try using OutputFile::copyPixels() instead."
                   );
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar8,local_1c0);
    __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  this_00 = Header::tileDescription((Header *)0x2437d9);
  other = Header::tileDescription((Header *)0x2437f0);
  bVar2 = TileDescription::operator==(this_00,other);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_348);
    poVar6 = std::operator<<(local_338,"Quick pixel copy from image file \"");
    pcVar7 = TiledInputFile::fileName((TiledInputFile *)0x24386c);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\" to image file \"");
    pcVar7 = fileName((TiledOutputFile *)0x2438c0);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,"\" failed. The files have different tile descriptions.");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar8,local_348);
    __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  Header::dataWindow((Header *)0x24399c);
  Header::dataWindow((Header *)0x2439b3);
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    (in_stack_fffffffffffff150,in_stack_fffffffffffff148);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4d0);
    poVar6 = std::operator<<(local_4c0,"Cannot copy pixels from image file \"");
    pcVar7 = TiledInputFile::fileName((TiledInputFile *)0x243a1d);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\" to image file \"");
    pcVar7 = fileName((TiledOutputFile *)0x243a71);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,"\". The files have different data windows.");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar8,local_4d0);
    __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pLVar9 = Header::lineOrder((Header *)0x243b4d);
  LVar1 = *pLVar9;
  pLVar9 = Header::lineOrder((Header *)0x243b75);
  if (LVar1 != *pLVar9) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_658);
    poVar6 = std::operator<<(local_648,"Quick pixel copy from image file \"");
    pcVar7 = TiledInputFile::fileName((TiledInputFile *)0x243bd9);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\" to image file \"");
    pcVar7 = fileName((TiledOutputFile *)0x243c2d);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,"\" failed. The files have different line orders.");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar8,local_658);
    __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  lx_00 = Header::compression((Header *)0x243d09);
  lx_01 = *lx_00;
  this_01 = (TiledOutputFile *)Header::compression((Header *)0x243d31);
  if (lx_01 != *(Compression *)&(this_01->super_GenericOutputFile)._vptr_GenericOutputFile) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_7e0);
    poVar6 = std::operator<<(local_7d0,"Quick pixel copy from image file \"");
    pcVar7 = TiledInputFile::fileName((TiledInputFile *)0x243d95);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\" to image file \"");
    pcVar7 = fileName((TiledOutputFile *)0x243de9);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,"\" failed. The files use different compression methods.");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar8,local_7e0);
    __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  Header::channels((Header *)0x243ec5);
  Header::channels((Header *)0x243edc);
  bVar2 = ChannelList::operator==(in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_968);
    poVar6 = std::operator<<(local_958,"Quick pixel copy from image file \"");
    pcVar7 = TiledInputFile::fileName((TiledInputFile *)0x243f58);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\" to image file \"");
    pcVar7 = fileName((TiledOutputFile *)0x243fac);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,"\" failed.  The files have different channel lists.");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar8,local_968);
    __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  bVar2 = TileOffsets::isEmpty(in_stack_fffffffffffff168);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_af0);
    poVar6 = std::operator<<(local_ae0,"Quick pixel copy from image file \"");
    pcVar7 = TiledInputFile::fileName((TiledInputFile *)0x2440f0);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\" to image file \"");
    pcVar7 = OStream::fileName((OStream *)0x24414c);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\" failed. \"");
    pcVar7 = fileName((TiledOutputFile *)0x2441a0);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,"\" already contains pixel data.");
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::LogicExc::LogicExc(this_02,local_af0);
    __cxa_throw(this_02,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
  }
  local_af4 = 0;
  LVar3 = levelMode(in_RDI);
  if (LVar3 < RIPMAP_LEVELS) {
    for (local_af8 = 0; iVar5 = local_af8, iVar4 = numLevels(in_stack_fffffffffffff2f0),
        iVar5 < iVar4; local_af8 = local_af8 + 1) {
      iVar5 = numXTiles(this_01,lx_01);
      iVar4 = numYTiles(this_01,lx_01);
      local_af4 = iVar5 * iVar4 + local_af4;
    }
  }
  else {
    if (LVar3 != RIPMAP_LEVELS) {
      pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar8,"Unknown LevelMode format.");
      __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    for (local_afc = 0; iVar5 = local_afc, iVar4 = numYLevels(in_RDI), iVar5 < iVar4;
        local_afc = local_afc + 1) {
      for (local_b00 = 0; iVar5 = local_b00, iVar4 = numXLevels(in_RDI), iVar5 < iVar4;
          local_b00 = local_b00 + 1) {
        iVar5 = numXTiles(this_01,lx_01);
        iVar4 = numYTiles(this_01,lx_01);
        local_af4 = iVar5 * iVar4 + local_af4;
      }
    }
  }
  local_b01 = in_RDI->_data->lineOrder == RANDOM_Y;
  std::allocator<int>::allocator((allocator<int> *)0x244550);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff160,
             (size_type)in_stack_fffffffffffff158,(allocator_type *)in_stack_fffffffffffff150);
  std::allocator<int>::~allocator((allocator<int> *)0x24457c);
  std::allocator<int>::allocator((allocator<int> *)0x2445c7);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff160,
             (size_type)in_stack_fffffffffffff158,(allocator_type *)in_stack_fffffffffffff150);
  std::allocator<int>::~allocator((allocator<int> *)0x2445f0);
  std::allocator<int>::allocator((allocator<int> *)0x24462f);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff160,
             (size_type)in_stack_fffffffffffff158,(allocator_type *)in_stack_fffffffffffff150);
  std::allocator<int>::~allocator((allocator<int> *)0x244655);
  std::allocator<int>::allocator((allocator<int> *)0x244694);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff160,
             (size_type)in_stack_fffffffffffff158,(allocator_type *)in_stack_fffffffffffff150);
  std::allocator<int>::~allocator((allocator<int> *)0x2446ba);
  if ((local_b01 & 1) != 0) {
    in_stack_fffffffffffff158 = (Data *)0x0;
    in_stack_fffffffffffff168 =
         (TileOffsets *)std::vector<int,_std::allocator<int>_>::operator[](&local_b20,0);
    in_stack_fffffffffffff170 =
         (Data *)std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_b40,(size_type)in_stack_fffffffffffff158);
    in_stack_fffffffffffff178 =
         std::vector<int,_std::allocator<int>_>::operator[]
                   (&local_b60,(size_type)in_stack_fffffffffffff158);
    std::vector<int,_std::allocator<int>_>::operator[]
              (&local_b80,(size_type)in_stack_fffffffffffff158);
    TiledInputFile::tileOrder
              (in_stack_fffffffffffff320,in_stack_fffffffffffff318,in_stack_fffffffffffff310,
               (int *)lx_00,(int *)this_01);
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b20,0);
    (in_RDI->_data->nextTileToWrite).dx = *pvVar10;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b40,0);
    (in_RDI->_data->nextTileToWrite).dy = *pvVar10;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b60,0);
    (in_RDI->_data->nextTileToWrite).lx = *pvVar10;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b80,0);
    (in_RDI->_data->nextTileToWrite).ly = *pvVar10;
    in_stack_fffffffffffff160 = local_10;
  }
  TVar11._8_8_ = in_stack_fffffffffffff148;
  TVar11._0_8_ = in_stack_fffffffffffff150;
  for (local_b88 = 0; local_b88 < local_af4; local_b88 = local_b88 + 1) {
    TiledInputFile::rawTileData
              (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
               in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
               in_stack_fffffffffffff710);
    anon_unknown_5::writeTileData
              (in_stack_fffffffffffff160,in_stack_fffffffffffff158,TVar11.dy,TVar11.dx,TVar11.ly,
               TVar11.lx,(char *)in_stack_fffffffffffff170,(int)in_stack_fffffffffffff178);
    if ((local_b01 & 1) == 0) {
      TVar11 = Data::nextTileCoord(in_stack_fffffffffffff170,(TileCoord *)in_stack_fffffffffffff168)
      ;
      in_RDI->_data->nextTileToWrite = TVar11;
    }
    else if (local_b88 < local_af4 + -1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b20,(long)(local_b88 + 1))
      ;
      (in_RDI->_data->nextTileToWrite).dx = *pvVar10;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b40,(long)(local_b88 + 1))
      ;
      (in_RDI->_data->nextTileToWrite).dy = *pvVar10;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b60,(long)(local_b88 + 1))
      ;
      (in_RDI->_data->nextTileToWrite).lx = *pvVar10;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b80,(long)(local_b88 + 1))
      ;
      (in_RDI->_data->nextTileToWrite).ly = *pvVar10;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector(TVar11._0_8_);
  std::vector<int,_std::allocator<int>_>::~vector(TVar11._0_8_);
  std::vector<int,_std::allocator<int>_>::~vector(TVar11._0_8_);
  std::vector<int,_std::allocator<int>_>::~vector(TVar11._0_8_);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x244b61);
  return;
}

Assistant:

void
TiledOutputFile::copyPixels (TiledInputFile& in)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_streamData);
#endif
    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!hdr.hasTileDescription () || !inHdr.hasTileDescription ())
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot perform a quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\".  The "
                   "output file is tiled, but the input file is not.  "
                   "Try using OutputFile::copyPixels() instead.");

    if (!(hdr.tileDescription () == inHdr.tileDescription ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different tile descriptions.");

    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". The "
                   "files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" "
                   "failed.  The files have different channel "
                   "lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    if (!_data->tileOffsets.isEmpty ())
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << _streamData->os->fileName ()
                << "\" "
                   "failed. \""
                << fileName ()
                << "\" "
                   "already contains pixel data.");

    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:

            for (int i_l = 0; i_l < numLevels (); ++i_l)
                numAllTiles += numXTiles (i_l) * numYTiles (i_l);

            break;

        case RIPMAP_LEVELS:

            for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
                for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                    numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    bool random_y = _data->lineOrder == RANDOM_Y;

    std::vector<int> dx_table (random_y ? numAllTiles : 1);
    std::vector<int> dy_table (random_y ? numAllTiles : 1);
    std::vector<int> lx_table (random_y ? numAllTiles : 1);
    std::vector<int> ly_table (random_y ? numAllTiles : 1);

    if (random_y)
    {
        in.tileOrder (&dx_table[0], &dy_table[0], &lx_table[0], &ly_table[0]);
        _data->nextTileToWrite.dx = dx_table[0];
        _data->nextTileToWrite.dy = dy_table[0];
        _data->nextTileToWrite.lx = lx_table[0];
        _data->nextTileToWrite.ly = ly_table[0];
    }

    for (int i = 0; i < numAllTiles; ++i)
    {
        const char* pixelData;
        int         pixelDataSize;

        int dx = _data->nextTileToWrite.dx;
        int dy = _data->nextTileToWrite.dy;
        int lx = _data->nextTileToWrite.lx;
        int ly = _data->nextTileToWrite.ly;

        in.rawTileData (dx, dy, lx, ly, pixelData, pixelDataSize);
        writeTileData (
            _streamData, _data, dx, dy, lx, ly, pixelData, pixelDataSize);

        if (random_y)
        {
            if (i < numAllTiles - 1)
            {
                _data->nextTileToWrite.dx = dx_table[i + 1];
                _data->nextTileToWrite.dy = dy_table[i + 1];
                _data->nextTileToWrite.lx = lx_table[i + 1];
                _data->nextTileToWrite.ly = ly_table[i + 1];
            }
        }
        else
        {
            _data->nextTileToWrite =
                _data->nextTileCoord (_data->nextTileToWrite);
        }
    }
}